

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void ARGB4444ToARGBRow_SSE2(uint8_t *src,uint8_t *dst,int width)

{
  uint8_t *puVar1;
  bool bVar2;
  undefined1 (*pauVar3) [16];
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int width_local;
  uint8_t *dst_local;
  uint8_t *src_local;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  auVar16._8_4_ = 0xf0f0f0f;
  auVar16._0_8_ = 0xf0f0f0f0f0f0f0f;
  auVar16._12_4_ = 0xf0f0f0f;
  auVar17._8_4_ = 0xf0f0f0f0;
  auVar17._0_8_ = 0xf0f0f0f0f0f0f0f0;
  auVar17._12_4_ = 0xf0f0f0f0;
  pauVar3 = (undefined1 (*) [16])src;
  do {
    auVar5 = *pauVar3 & auVar16;
    auVar14 = *pauVar3 & auVar17;
    auVar13 = psllw(auVar5,4);
    auVar15._0_2_ = auVar14._0_2_ >> 4;
    auVar15._2_2_ = auVar14._2_2_ >> 4;
    auVar15._4_2_ = auVar14._4_2_ >> 4;
    auVar15._6_2_ = auVar14._6_2_ >> 4;
    auVar15._8_2_ = auVar14._8_2_ >> 4;
    auVar15._10_2_ = auVar14._10_2_ >> 4;
    auVar15._12_2_ = auVar14._12_2_ >> 4;
    auVar15._14_2_ = auVar14._14_2_ >> 4;
    auVar5 = auVar5 | auVar13;
    auVar14 = auVar14 | auVar15;
    auVar12._0_14_ = auVar5._0_14_;
    auVar12[0xe] = auVar5[7];
    auVar12[0xf] = auVar14[7];
    auVar11._14_2_ = auVar12._14_2_;
    auVar11._0_13_ = auVar5._0_13_;
    auVar11[0xd] = auVar14[6];
    auVar10._13_3_ = auVar11._13_3_;
    auVar10._0_12_ = auVar5._0_12_;
    auVar10[0xc] = auVar5[6];
    auVar9._12_4_ = auVar10._12_4_;
    auVar9._0_11_ = auVar5._0_11_;
    auVar9[0xb] = auVar14[5];
    auVar8._11_5_ = auVar9._11_5_;
    auVar8._0_10_ = auVar5._0_10_;
    auVar8[10] = auVar5[5];
    auVar7._10_6_ = auVar8._10_6_;
    auVar7._0_9_ = auVar5._0_9_;
    auVar7[9] = auVar14[4];
    auVar6._9_7_ = auVar7._9_7_;
    auVar6._0_8_ = auVar5._0_8_;
    auVar6[8] = auVar5[4];
    auVar13._8_8_ = auVar6._8_8_;
    auVar13[7] = auVar14[3];
    auVar13[6] = auVar5[3];
    auVar13[5] = auVar14[2];
    auVar13[4] = auVar5[2];
    auVar13[3] = auVar14[1];
    auVar13[2] = auVar5[1];
    auVar13[0] = auVar5[0];
    auVar13[1] = auVar14[0];
    *(undefined1 (*) [16])(dst + (long)pauVar3 * 2 + (long)src * -2) = auVar13;
    puVar1 = dst + (long)pauVar3 * 2 + (long)src * -2 + 0x10;
    *puVar1 = auVar5[8];
    puVar1[1] = auVar14[8];
    puVar1[2] = auVar5[9];
    puVar1[3] = auVar14[9];
    puVar1[4] = auVar5[10];
    puVar1[5] = auVar14[10];
    puVar1[6] = auVar5[0xb];
    puVar1[7] = auVar14[0xb];
    puVar1[8] = auVar5[0xc];
    puVar1[9] = auVar14[0xc];
    puVar1[10] = auVar5[0xd];
    puVar1[0xb] = auVar14[0xd];
    puVar1[0xc] = auVar5[0xe];
    puVar1[0xd] = auVar14[0xe];
    puVar1[0xe] = auVar5[0xf];
    puVar1[0xf] = auVar14[0xf];
    pauVar3 = pauVar3 + 1;
    iVar4 = width + -8;
    bVar2 = 7 < width;
    width = iVar4;
  } while (iVar4 != 0 && bVar2);
  return;
}

Assistant:

void ARGB4444ToARGBRow_SSE2(const uint8_t* src, uint8_t* dst, int width) {
  asm volatile(
      "mov         $0xf0f0f0f,%%eax              \n"
      "movd        %%eax,%%xmm4                  \n"
      "pshufd      $0x0,%%xmm4,%%xmm4            \n"
      "movdqa      %%xmm4,%%xmm5                 \n"
      "pslld       $0x4,%%xmm5                   \n"
      "sub         %0,%1                         \n"
      "sub         %0,%1                         \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqa      %%xmm0,%%xmm2                 \n"
      "pand        %%xmm4,%%xmm0                 \n"
      "pand        %%xmm5,%%xmm2                 \n"
      "movdqa      %%xmm0,%%xmm1                 \n"
      "movdqa      %%xmm2,%%xmm3                 \n"
      "psllw       $0x4,%%xmm1                   \n"
      "psrlw       $0x4,%%xmm3                   \n"
      "por         %%xmm1,%%xmm0                 \n"
      "por         %%xmm3,%%xmm2                 \n"
      "movdqa      %%xmm0,%%xmm1                 \n"
      "punpcklbw   %%xmm2,%%xmm0                 \n"
      "punpckhbw   %%xmm2,%%xmm1                 \n"
      "movdqu      %%xmm0,0x00(%1,%0,2)          \n"
      "movdqu      %%xmm1,0x10(%1,%0,2)          \n"
      "lea         0x10(%0),%0                   \n"
      "sub         $0x8,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src),   // %0
        "+r"(dst),   // %1
        "+r"(width)  // %2
      :
      : "memory", "cc", "eax", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5");
}